

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t mime_mem_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  long lVar1;
  ulong __n;
  
  lVar1 = *(long *)((long)instream + 0x98);
  __n = *(long *)((long)instream + 0x78) - lVar1;
  if (nitems <= __n) {
    __n = nitems;
  }
  if (__n != 0) {
    memcpy(buffer,(void *)(lVar1 + *(long *)((long)instream + 0x20)),__n);
    lVar1 = *(long *)((long)instream + 0x98);
  }
  *(ulong *)((long)instream + 0x98) = lVar1 + __n;
  return __n;
}

Assistant:

static size_t mime_mem_read(char *buffer, size_t size, size_t nitems,
                            void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;
  size_t sz = (size_t) part->datasize - part->state.offset;
  (void) size;   /* Always 1.*/

  if(sz > nitems)
    sz = nitems;

  if(sz)
    memcpy(buffer, (char *) &part->data[part->state.offset], sz);

  part->state.offset += sz;
  return sz;
}